

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

StringPtr * __thiscall
kj::Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_>::insert
          (Table<kj::StringPtr,_kj::TreeIndex<kj::_::(anonymous_namespace)::StringCompare>_> *this,
          StringPtr *row)

{
  long lVar1;
  undefined8 *puVar2;
  StringPtr *pSVar3;
  size_t sVar4;
  Impl<0UL,_false> local_28 [16];
  
  Impl<0UL,_false>::insert
            (local_28,(Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                       *)this,*(long *)(this + 8) - *(long *)this >> 4,row,0xffffffff);
  if (local_28[0] != (Impl<0UL,_false>)0x1) {
    lVar1 = *(long *)(this + 0x10);
    if (*(long *)(this + 8) == lVar1) {
      sVar4 = 4;
      if (lVar1 != *(long *)this) {
        sVar4 = lVar1 - *(long *)this >> 3;
      }
      Vector<kj::StringPtr>::setCapacity((Vector<kj::StringPtr> *)this,sVar4);
    }
    puVar2 = *(undefined8 **)(this + 8);
    sVar4 = (row->content).size_;
    *puVar2 = (row->content).ptr;
    puVar2[1] = sVar4;
    pSVar3 = *(StringPtr **)(this + 8);
    *(StringPtr **)(this + 8) = pSVar3 + 1;
    return pSVar3;
  }
  _::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  if (kj::none != Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }
}